

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleAbstractSpinBox::lineEditIface(QAccessibleAbstractSpinBox *this)

{
  QAccessibleLineEdit *pQVar1;
  QAbstractSpinBox *this_00;
  QWidget *w;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->lineEdit;
  if (pQVar1 == (QAccessibleLineEdit *)0x0) {
    pQVar1 = (QAccessibleLineEdit *)operator_new(0x30);
    this_00 = (QAbstractSpinBox *)abstractSpinBox(this);
    w = &QAbstractSpinBox::lineEdit(this_00)->super_QWidget;
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    QAccessibleLineEdit::QAccessibleLineEdit(pQVar1,w,(QString *)&local_38);
    this->lineEdit = pQVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    pQVar1 = this->lineEdit;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QAccessibleInterface *)pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractSpinBox::lineEditIface() const
{
#if QT_CONFIG(lineedit)
    // QAccessibleLineEdit is only used to forward the text functions
    if (!lineEdit)
        lineEdit = new QAccessibleLineEdit(abstractSpinBox()->lineEdit());
    return lineEdit;
#else
    return nullptr;
#endif
}